

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O2

void EDCircles::addArc(MyArc *arcs,int *noArcs,double xc,double yc,double r,double circleFitError,
                      double sTheta,double eTheta,int turn,int segmentNo,EllipseEquation *pEq,
                      double ellipseFitError,int sx,int sy,int ex,int ey,double *x,double *y,
                      int noPixels,double overlapRatio)

{
  double *pdVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  iVar2 = *noArcs;
  arcs[iVar2].xc = xc;
  arcs[iVar2].yc = yc;
  arcs[iVar2].r = r;
  arcs[iVar2].circleFitError = circleFitError;
  arcs[iVar2].sTheta = sTheta;
  arcs[iVar2].eTheta = eTheta;
  dVar3 = computeEllipsePerimeter(pEq);
  iVar2 = *noArcs;
  arcs[iVar2].coverRatio = ((double)noPixels * (1.0 - overlapRatio)) / dVar3;
  arcs[iVar2].turn = turn;
  arcs[*noArcs].segmentNo = segmentNo;
  iVar2 = *noArcs;
  arcs[iVar2].isEllipse = true;
  dVar3 = pEq->coeff[1];
  dVar4 = pEq->coeff[2];
  dVar5 = pEq->coeff[3];
  dVar6 = pEq->coeff[4];
  dVar7 = pEq->coeff[5];
  arcs[iVar2].eq.coeff[0] = pEq->coeff[0];
  arcs[iVar2].eq.coeff[1] = dVar3;
  pdVar1 = arcs[iVar2].eq.coeff + 2;
  *pdVar1 = dVar4;
  pdVar1[1] = dVar5;
  pdVar1 = arcs[iVar2].eq.coeff + 4;
  *pdVar1 = dVar6;
  pdVar1[1] = dVar7;
  arcs[iVar2].eq.coeff[6] = pEq->coeff[6];
  iVar2 = *noArcs;
  arcs[iVar2].ellipseFitError = ellipseFitError;
  arcs[iVar2].sx = sx;
  arcs[*noArcs].sy = sy;
  arcs[*noArcs].ex = ex;
  arcs[*noArcs].ey = ey;
  iVar2 = *noArcs;
  arcs[iVar2].x = x;
  (&arcs[iVar2].x)[1] = y;
  arcs[iVar2].noPixels = noPixels;
  *noArcs = *noArcs + 1;
  return;
}

Assistant:

void EDCircles::addArc(MyArc * arcs, int & noArcs, double xc, double yc, double r, double circleFitError, double sTheta, double eTheta, int turn, int segmentNo, EllipseEquation * pEq, double ellipseFitError, int sx, int sy, int ex, int ey, double * x, double * y, int noPixels, double overlapRatio)
{
	arcs[noArcs].xc = xc;
	arcs[noArcs].yc = yc;
	arcs[noArcs].r = r;
	arcs[noArcs].circleFitError = circleFitError;

	arcs[noArcs].sTheta = sTheta;
	arcs[noArcs].eTheta = eTheta;
	arcs[noArcs].coverRatio = (double)((1.0 - overlapRatio)*noPixels) / computeEllipsePerimeter(pEq);
	//  arcs[noArcs].coverRatio = noPixels/ComputeEllipsePerimeter(pEq);
	//  arcs[noArcs].coverRatio = ArcLength(sTheta, eTheta)/(TWOPI);
	
	arcs[noArcs].turn = turn;

	arcs[noArcs].segmentNo = segmentNo;

	arcs[noArcs].isEllipse = true;
	arcs[noArcs].eq = *pEq;
	arcs[noArcs].ellipseFitError = ellipseFitError;

	arcs[noArcs].sx = sx;
	arcs[noArcs].sy = sy;
	arcs[noArcs].ex = ex;
	arcs[noArcs].ey = ey;

	arcs[noArcs].x = x;
	arcs[noArcs].y = y;
	arcs[noArcs].noPixels = noPixels;

	noArcs++;
}